

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one-of.h
# Opt level: O1

void __thiscall
kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>::moveFrom
          (OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *this,
          OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *other)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  this->tag = other->tag;
  if (other->tag == 1) {
    uVar1 = *(undefined8 *)&other->field_1;
    uVar2 = *(undefined8 *)((long)&other->field_1 + 8);
    uVar3 = *(undefined8 *)((long)&other->field_1 + 0x18);
    *(undefined8 *)((long)&this->field_1 + 0x10) = *(undefined8 *)((long)&other->field_1 + 0x10);
    *(undefined8 *)((long)&this->field_1 + 0x18) = uVar3;
    *(undefined8 *)&this->field_1 = uVar1;
    *(undefined8 *)((long)&this->field_1 + 8) = uVar2;
    *(undefined8 *)((long)&this->field_1 + 0x20) = *(undefined8 *)((long)&other->field_1 + 0x20);
    *(undefined8 *)((long)&this->field_1 + 0x28) = *(undefined8 *)((long)&other->field_1 + 0x28);
    *(undefined8 *)((long)&other->field_1 + 0x28) = 0;
  }
  if (other->tag == 2) {
    *(undefined8 *)((long)&this->field_1 + 0x10) = *(undefined8 *)((long)&other->field_1 + 0x10);
    uVar1 = *(undefined8 *)((long)&other->field_1 + 8);
    *(undefined8 *)&this->field_1 = *(undefined8 *)&other->field_1;
    *(undefined8 *)((long)&this->field_1 + 8) = uVar1;
    *(undefined8 *)((long)&this->field_1 + 0x18) = *(undefined8 *)((long)&other->field_1 + 0x18);
    *(undefined8 *)((long)&this->field_1 + 0x20) = *(undefined8 *)((long)&other->field_1 + 0x20);
    *(undefined8 *)((long)&other->field_1 + 0x20) = 0;
  }
  return;
}

Assistant:

void moveFrom(OneOf& other) {
    // Initialize as a copy of `other`.  Expects that `this` starts out uninitialized, so the tag
    // is invalid.
    tag = other.tag;
    doAll(moveVariantFrom<Variants>(other)...);
  }